

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double>
::load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double>
           *this,initializer_list<bool> *call)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<type_caster<value_and_holder>,_type_caster<vector<unsigned_int,_allocator<unsigned_int>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<double,_void>_>_>
  *this_00;
  reference pvVar2;
  __tuple_element_t<1UL,_tuple<type_caster<value_and_holder>,_type_caster<vector<unsigned_int,_allocator<unsigned_int>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<double,_void>_>_>
  *this_01;
  __tuple_element_t<2UL,_tuple<type_caster<value_and_holder>,_type_caster<vector<unsigned_int,_allocator<unsigned_int>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<double,_void>_>_>
  *this_02;
  __tuple_element_t<3UL,_tuple<type_caster<value_and_holder>,_type_caster<vector<unsigned_int,_allocator<unsigned_int>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<double,_void>_>_>
  *this_03;
  __tuple_element_t<4UL,_tuple<type_caster<value_and_holder>,_type_caster<vector<unsigned_int,_allocator<unsigned_int>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<double,_void>_>_>
  *this_04;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  handle local_a8;
  reference local_a0;
  handle local_90;
  reference local_88;
  handle local_78;
  reference local_70;
  handle local_60;
  reference local_58;
  handle local_48;
  bool local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  initializer_list<bool> local_38;
  initializer_list<bool> *local_28;
  initializer_list<bool> *__range3;
  function_call *call_local;
  argument_loader<pybind11::detail::value_and_holder_&,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_double>
  *this_local;
  
  __range3 = call;
  call_local = (function_call *)this;
  this_00 = std::
            get<0ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<unsigned_int,std::allocator<unsigned_int>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<double,void>>
                      ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<double,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,0);
  local_48.m_ptr = pvVar2->m_ptr;
  local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
  local_3d = type_caster<pybind11::detail::value_and_holder,_void>::load(this_00,local_48,bVar1);
  this_01 = std::
            get<1ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<unsigned_int,std::allocator<unsigned_int>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<double,void>>
                      ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<double,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,1);
  local_60.m_ptr = pvVar2->m_ptr;
  local_70 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),1);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_70);
  local_3c = list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::
             load(&this_01->
                   super_list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>
                  ,local_60,bVar1);
  this_02 = std::
            get<2ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<unsigned_int,std::allocator<unsigned_int>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<double,void>>
                      ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<double,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,2);
  local_78.m_ptr = pvVar2->m_ptr;
  local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),2);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_88);
  local_3b = list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
                       (&this_02->
                         super_list_caster<std::vector<float,_std::allocator<float>_>,_float>,
                        local_78,bVar1);
  this_03 = std::
            get<3ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<unsigned_int,std::allocator<unsigned_int>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<double,void>>
                      ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<double,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,3);
  local_90.m_ptr = pvVar2->m_ptr;
  local_a0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),3);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a0);
  local_3a = list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
                       (&this_03->
                         super_list_caster<std::vector<float,_std::allocator<float>_>,_float>,
                        local_90,bVar1);
  this_04 = std::
            get<4ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<std::vector<unsigned_int,std::allocator<unsigned_int>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<double,void>>
                      ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<double,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,4);
  local_a8.m_ptr = pvVar2->m_ptr;
  ___begin0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),4);
  bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__begin0);
  local_39 = type_caster<double,_void>::load(this_04,local_a8,bVar1);
  local_38._M_array = &local_3d;
  local_38._M_len = 5;
  local_28 = &local_38;
  __end0 = std::initializer_list<bool>::begin(local_28);
  pbVar3 = std::initializer_list<bool>::end(local_28);
  while( true ) {
    if (__end0 == pbVar3) {
      return true;
    }
    if ((*__end0 & 1U) == 0) break;
    __end0 = __end0 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }